

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O2

void IDAFreeVectors(IDAMem IDA_mem)

{
  ulong uVar1;
  int iVar2;
  
  N_VDestroy(IDA_mem->ida_ewt);
  IDA_mem->ida_ewt = (N_Vector)0x0;
  N_VDestroy(IDA_mem->ida_ee);
  IDA_mem->ida_ee = (N_Vector)0x0;
  N_VDestroy(IDA_mem->ida_delta);
  IDA_mem->ida_delta = (N_Vector)0x0;
  N_VDestroy(IDA_mem->ida_yypredict);
  IDA_mem->ida_yypredict = (N_Vector)0x0;
  N_VDestroy(IDA_mem->ida_yppredict);
  IDA_mem->ida_yppredict = (N_Vector)0x0;
  N_VDestroy(IDA_mem->ida_savres);
  IDA_mem->ida_savres = (N_Vector)0x0;
  N_VDestroy(IDA_mem->ida_tempv1);
  IDA_mem->ida_tempv1 = (N_Vector)0x0;
  N_VDestroy(IDA_mem->ida_tempv2);
  IDA_mem->ida_tempv2 = (N_Vector)0x0;
  N_VDestroy(IDA_mem->ida_tempv3);
  IDA_mem->ida_tempv3 = (N_Vector)0x0;
  iVar2 = 3;
  if (3 < IDA_mem->ida_maxord_alloc) {
    iVar2 = IDA_mem->ida_maxord_alloc;
  }
  for (uVar1 = 0; iVar2 + 1 != uVar1; uVar1 = uVar1 + 1) {
    N_VDestroy(IDA_mem->ida_phi[uVar1]);
    IDA_mem->ida_phi[uVar1] = (N_Vector)0x0;
  }
  IDA_mem->ida_lrw = IDA_mem->ida_lrw - IDA_mem->ida_lrw1 * (ulong)(iVar2 + 10);
  IDA_mem->ida_liw = IDA_mem->ida_liw - (ulong)(iVar2 + 10) * IDA_mem->ida_liw1;
  if (IDA_mem->ida_VatolMallocDone != 0) {
    N_VDestroy(IDA_mem->ida_Vatol);
    IDA_mem->ida_Vatol = (N_Vector)0x0;
    IDA_mem->ida_lrw = IDA_mem->ida_lrw - IDA_mem->ida_lrw1;
    IDA_mem->ida_liw = IDA_mem->ida_liw - IDA_mem->ida_liw1;
  }
  if (IDA_mem->ida_constraintsMallocDone != 0) {
    N_VDestroy(IDA_mem->ida_constraints);
    IDA_mem->ida_constraints = (N_Vector)0x0;
    IDA_mem->ida_lrw = IDA_mem->ida_lrw - IDA_mem->ida_lrw1;
    IDA_mem->ida_liw = IDA_mem->ida_liw - IDA_mem->ida_liw1;
  }
  if (IDA_mem->ida_idMallocDone != 0) {
    N_VDestroy(IDA_mem->ida_id);
    IDA_mem->ida_id = (N_Vector)0x0;
    IDA_mem->ida_lrw = IDA_mem->ida_lrw - IDA_mem->ida_lrw1;
    IDA_mem->ida_liw = IDA_mem->ida_liw - IDA_mem->ida_liw1;
  }
  return;
}

Assistant:

static void IDAFreeVectors(IDAMem IDA_mem)
{
  int j, maxcol;

  N_VDestroy(IDA_mem->ida_ewt);
  IDA_mem->ida_ewt = NULL;
  N_VDestroy(IDA_mem->ida_ee);
  IDA_mem->ida_ee = NULL;
  N_VDestroy(IDA_mem->ida_delta);
  IDA_mem->ida_delta = NULL;
  N_VDestroy(IDA_mem->ida_yypredict);
  IDA_mem->ida_yypredict = NULL;
  N_VDestroy(IDA_mem->ida_yppredict);
  IDA_mem->ida_yppredict = NULL;
  N_VDestroy(IDA_mem->ida_savres);
  IDA_mem->ida_savres = NULL;
  N_VDestroy(IDA_mem->ida_tempv1);
  IDA_mem->ida_tempv1 = NULL;
  N_VDestroy(IDA_mem->ida_tempv2);
  IDA_mem->ida_tempv2 = NULL;
  N_VDestroy(IDA_mem->ida_tempv3);
  IDA_mem->ida_tempv3 = NULL;
  maxcol              = SUNMAX(IDA_mem->ida_maxord_alloc, 3);
  for (j = 0; j <= maxcol; j++)
  {
    N_VDestroy(IDA_mem->ida_phi[j]);
    IDA_mem->ida_phi[j] = NULL;
  }

  IDA_mem->ida_lrw -= (maxcol + 10) * IDA_mem->ida_lrw1;
  IDA_mem->ida_liw -= (maxcol + 10) * IDA_mem->ida_liw1;

  if (IDA_mem->ida_VatolMallocDone)
  {
    N_VDestroy(IDA_mem->ida_Vatol);
    IDA_mem->ida_Vatol = NULL;
    IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
    IDA_mem->ida_liw -= IDA_mem->ida_liw1;
  }

  if (IDA_mem->ida_constraintsMallocDone)
  {
    N_VDestroy(IDA_mem->ida_constraints);
    IDA_mem->ida_constraints = NULL;
    IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
    IDA_mem->ida_liw -= IDA_mem->ida_liw1;
  }

  if (IDA_mem->ida_idMallocDone)
  {
    N_VDestroy(IDA_mem->ida_id);
    IDA_mem->ida_id = NULL;
    IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
    IDA_mem->ida_liw -= IDA_mem->ida_liw1;
  }
}